

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O0

uchar * __thiscall
Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>::allocate
          (STDAllocator<unsigned_char,_Diligent::IMemoryAllocator> *this,size_t count)

{
  int iVar1;
  undefined4 extraout_var;
  size_t count_local;
  STDAllocator<unsigned_char,_Diligent::IMemoryAllocator> *this_local;
  
  iVar1 = (*this->m_Allocator->_vptr_IMemoryAllocator[2])
                    (this->m_Allocator,count,1,this->m_dvpDescription,this->m_dvpFileName,
                     (ulong)(uint)this->m_dvpLineNumber);
  return (uchar *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T* allocate(std::size_t count)
    {
#ifndef DILIGENT_DEVELOPMENT
        static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
        static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
        static constexpr Int32       m_dvpLineNumber  = -1;
#endif
        return reinterpret_cast<T*>(m_Allocator.AllocateAligned(count * sizeof(T), alignof(T), m_dvpDescription, m_dvpFileName, m_dvpLineNumber));
    }